

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void expand_object(tgestate_t *state,object_t index,uint8_t *output)

{
  uint8_t uVar1;
  int iVar2;
  tgeobject_t *ptVar3;
  uint uVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  int val;
  int byte;
  uint8_t *data;
  int self_width;
  int height;
  int width;
  tgeobject_t *obj;
  int columns;
  uint8_t *output_local;
  object_t index_local;
  tgestate_t *state_local;
  
  iVar2 = state->columns;
  ptVar3 = interior_object_defs[index];
  uVar4 = (uint)ptVar3->width;
  height = (int)ptVar3->height;
  data = ptVar3->data;
  width = uVar4;
  output_local = output;
LAB_00107ab3:
  byte = (int)*data;
  pbVar5 = data;
  if (byte == 0xff) {
    pbVar5 = data + 1;
    byte = (int)data[1];
    if (byte != 0xff) {
      byte = byte & 0xf0;
      if (0x7f < (uint)byte) {
        byte = *pbVar5 & 0x7f;
        uVar1 = data[2];
        do {
          if (uVar1 != '\0') {
            *output_local = uVar1;
          }
          output_local = output_local + 1;
          width = width + -1;
          if (width == 0) {
            output_local = output_local + (int)(iVar2 - uVar4);
            height = height + -1;
            width = uVar4;
            if (height == 0) {
              return;
            }
          }
          byte = byte + -1;
        } while (byte != 0);
        data = data + 3;
        goto LAB_00107ab3;
      }
      if (byte == 0x40) {
        byte = *pbVar5 & 0xf;
        val = (uint)data[2];
        do {
          puVar6 = output_local + 1;
          *output_local = (uint8_t)val;
          width = width + -1;
          output_local = puVar6;
          if (width == 0) {
            output_local = puVar6 + (int)(iVar2 - uVar4);
            height = height + -1;
            width = uVar4;
            if (height == 0) {
              return;
            }
          }
          byte = byte + -1;
          val = val + 1;
        } while (byte != 0);
        data = data + 3;
        goto LAB_00107ab3;
      }
    }
  }
  data = pbVar5;
  if (byte != 0) {
    *output_local = (uint8_t)byte;
  }
  data = data + 1;
  output_local = output_local + 1;
  width = width + -1;
  if (width == 0) {
    output_local = output_local + (int)(iVar2 - uVar4);
    height = height + -1;
    width = uVar4;
    if (height == 0) {
      return;
    }
  }
  goto LAB_00107ab3;
}

Assistant:

void expand_object(tgestate_t *state, object_t index, uint8_t *output)
{
  int                columns;       /* new var */
  const tgeobject_t *obj;           /* was HL */
  int                width, height; /* was B, C */
  int                self_width;    /* was $6AE7 */
  const uint8_t     *data;          /* was HL */
  int                byte;          /* was A */
  int                val;           /* was A' */

  assert(state  != NULL);
  assert(index < interiorobject__LIMIT);
  assert(output != NULL); // assert within tilebuf?

  columns     = state->columns; // Conv: Added.

  assert(columns == 24); // did i add this for any particular reason?

  obj         = interior_object_defs[index];

  width       = obj->width;
  height      = obj->height;

  self_width  = width;

  data        = &obj->data[0];

  assert(width  > 0);
  assert(height > 0);

  do
  {
    do
    {
expand:
      assert(width  > 0);
      assert(height > 0);

      byte = *data;
      if (byte == interiortile_ESCAPE)
      {
        byte = *++data;
        if (byte != interiortile_ESCAPE)
        {
          byte &= 0xF0;
          if (byte >= 128)
            goto repetition;
          if (byte == 64)
            goto range;
          assert(0);
        }
      }

      if (byte)
        *output = byte;
      data++;
      output++;
    }
    while (--width);

    width = self_width;
    output += columns - width; /* move to next row */
  }
  while (--height);

  return;


repetition:
  byte = *data++ & 0x7F;
  val = *data;
  do
  {
    if (val > 0)
      *output = val;
    output++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - width; /* move to next row */

      // val = *data; // needless reload in C version (required in original)

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;


range:
  byte = *data++ & 0x0F;
  val = *data;
  do
  {
    *output++ = val++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - self_width; /* move to next row */

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;
}